

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_module_exports(wasm_module_t *module,wasm_exporttype_vec_t *out)

{
  pointer pEVar1;
  Module *pMVar2;
  wasm_exporttype_t *this;
  size_t i;
  ulong uVar3;
  long lVar4;
  ExportType local_58;
  
  pMVar2 = wasm_ref_t::As<wabt::interp::Module>(&module->super_wasm_ref_t);
  lVar4 = 0;
  fprintf(_stderr,"CAPI: [%s] %zx\n","wasm_module_exports",
          ((long)(pMVar2->export_types_).
                 super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pMVar2->export_types_).
                super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  wasm_exporttype_vec_new_uninitialized
            (out,((long)(pMVar2->export_types_).
                        super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar2->export_types_).
                       super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  uVar3 = 0;
  while( true ) {
    pEVar1 = (pMVar2->export_types_).
             super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pMVar2->export_types_).
                       super__Vector_base<wabt::interp::ExportType,_std::allocator<wabt::interp::ExportType>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar1) / 0x28) <= uVar3)
    break;
    this = (wasm_exporttype_t *)operator_new(0x40);
    wabt::interp::ExportType::ExportType
              (&local_58,(ExportType *)((long)&(pEVar1->name)._M_dataplus._M_p + lVar4));
    wasm_exporttype_t::wasm_exporttype_t(this,&local_58);
    out->data[uVar3] = this;
    wabt::interp::ExportType::~ExportType(&local_58);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x28;
  }
  return;
}

Assistant:

void wasm_module_exports(const wasm_module_t* module,
                         own wasm_exporttype_vec_t* out) {
  auto&& export_types = module->As<Module>()->export_types();
  TRACE("%" PRIzx, export_types.size());
  wasm_exporttype_vec_new_uninitialized(out, export_types.size());

  for (size_t i = 0; i < export_types.size(); ++i) {
    out->data[i] = new wasm_exporttype_t{export_types[i]};
  }
}